

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O0

FieldDef *
bidfx_public_api::price::pixie::PriceUpdateDecoder::GetFieldDef
          (FieldDef *__return_storage_ptr__,ByteBuffer *buffer,IDataDictionary *data_dictionary,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price_map,uint32_t fid)

{
  bool bVar1;
  DecodingException *this;
  FieldDef *to_copy;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  optional<bidfx_public_api::price::pixie::FieldDef> fieldDef;
  uint32_t fid_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *price_map_local;
  IDataDictionary *data_dictionary_local;
  ByteBuffer *buffer_local;
  
  fieldDef.super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>._M_payload.
  super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
  super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._52_4_ = fid;
  (**data_dictionary->_vptr_IDataDictionary)(local_68,data_dictionary,(ulong)fid);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_68);
  if (!bVar1) {
    this = (DecodingException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"attempted to get a field def which does not exist",&local_89);
    exceptions::DecodingException::DecodingException(this,&local_88);
    __cxa_throw(this,&exceptions::DecodingException::typeinfo,
                exceptions::DecodingException::~DecodingException);
  }
  to_copy = std::optional<bidfx_public_api::price::pixie::FieldDef>::operator*
                      ((optional<bidfx_public_api::price::pixie::FieldDef> *)local_68);
  FieldDef::FieldDef(__return_storage_ptr__,to_copy);
  std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional
            ((optional<bidfx_public_api::price::pixie::FieldDef> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

FieldDef PriceUpdateDecoder::GetFieldDef(ByteBuffer& buffer, IDataDictionary& data_dictionary,
                                         std::map<std::string, PriceField>& price_map, uint32_t fid)
{
    std::optional<FieldDef> fieldDef = data_dictionary.FieldDefByFid(fid);
    if (!fieldDef)
    {
        throw DecodingException("attempted to get a field def which does not exist");
    }
    return *fieldDef;
}